

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.hpp
# Opt level: O3

int __thiscall front::symbol::ArraySymbol::getLen(ArraySymbol *this)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar2;
  int iVar3;
  
  iVar2 = this->_size;
  if (iVar2 == -1) {
    getSize(this);
    iVar2 = this->_size;
  }
  peVar1 = (this->_item).super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this_00 = (this->_item).super___shared_ptr<front::symbol::Symbol,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    iVar3 = *(int *)&peVar1[1]._name._M_dataplus._M_p;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    iVar3 = *(int *)&peVar1[1]._name._M_dataplus._M_p;
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return iVar2 / iVar3;
}

Assistant:

int getLen() {
    if (_size == -1) {
      getSize();
    }

    return _size / static_pointer_cast<IntSymbol>(_item)->getSize();
  }